

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O3

unsigned_short __thiscall
WrittenFontCFF::EncodeGlyph(WrittenFontCFF *this,uint inGlyph,ULongVector *inCharacters)

{
  pointer puVar1;
  byte bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_> _Var4;
  uint inGlyph_00;
  WrittenFontRepresentation *pWVar5;
  _Rb_tree_header *p_Var6;
  ulong uVar7;
  ushort uVar8;
  ulong uVar9;
  bool bVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_bool> pVar11;
  GlyphEncodingInfo local_90;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  uVar9 = (ulong)inGlyph;
  pWVar5 = (this->super_AbstractWrittenFont).mANSIRepresentation;
  inGlyph_00 = inGlyph;
  if ((pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    GlyphEncodingInfo::GlyphEncodingInfo(&local_90,0,0);
    local_70.first = 0;
    local_70.second.mEncodedCharacter = local_90.mEncodedCharacter;
    local_70.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_70.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_70.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
    ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                *)pWVar5,&local_70);
    if (local_70.second.mUnicodeCharacters.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.second.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.second.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.second.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.mUnicodeCharacters.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    inGlyph_00 = 0;
    RemoveFromFreeList(this,'\0');
    this->mAssignedPositions[0] = 0;
    this->mAssignedPositionsAvailable[0] = false;
    pWVar5 = (this->super_AbstractWrittenFont).mANSIRepresentation;
  }
  p_Var3 = (pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var6 = &(pWVar5->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
    _Var4._M_node = &p_Var6->_M_header;
    do {
      bVar10 = p_Var3[1]._M_color < inGlyph;
      if (!bVar10) {
        _Var4._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar10];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var4._M_node != p_Var6) && (_Var4._M_node[1]._M_color <= inGlyph))
    goto LAB_001f3cde;
  }
  puVar1 = (inCharacters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar1 != (inCharacters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start) {
    uVar9 = (ulong)(byte)puVar1[-1];
  }
  uVar8 = (ushort)uVar9;
  uVar7 = uVar9 & 0xff;
  if (this->mAssignedPositionsAvailable[uVar7] == true) {
    RemoveFromFreeList(this,(uchar)uVar9);
  }
  else {
    bVar2 = AllocateFromFreeList(this,inGlyph_00);
    uVar8 = (ushort)bVar2;
    uVar7 = (ulong)bVar2;
  }
  this->mAssignedPositions[uVar7] = inGlyph;
  this->mAssignedPositionsAvailable[uVar7] = false;
  pWVar5 = (this->super_AbstractWrittenFont).mANSIRepresentation;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,inCharacters);
  GlyphEncodingInfo::GlyphEncodingInfo(&local_90,uVar8 & 0xff,&local_48);
  local_70.second.mEncodedCharacter = local_90.mEncodedCharacter;
  local_70.second.mUnicodeCharacters.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_90.mUnicodeCharacters.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_70.second.mUnicodeCharacters.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_90.mUnicodeCharacters.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_70.second.mUnicodeCharacters.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.first = inGlyph;
  pVar11 = std::
           _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
           ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
                     ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                       *)pWVar5,&local_70);
  _Var4 = pVar11.first._M_node;
  if (local_70.second.mUnicodeCharacters.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.second.mUnicodeCharacters.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.second.mUnicodeCharacters.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.second.mUnicodeCharacters.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.mUnicodeCharacters.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.mUnicodeCharacters.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.mUnicodeCharacters.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  this->mAvailablePositionsCount = this->mAvailablePositionsCount + 0xff;
LAB_001f3cde:
  return *(unsigned_short *)&_Var4._M_node[1]._M_parent;
}

Assistant:

unsigned short WrittenFontCFF::EncodeGlyph(unsigned int inGlyph,const ULongVector& inCharacters)
{
	// for the first time, add also 0,0 mapping
	if(mANSIRepresentation->mGlyphIDToEncodedChar.size() == 0)
	{
		mANSIRepresentation->mGlyphIDToEncodedChar.insert(UIntToGlyphEncodingInfoMap::value_type(0,GlyphEncodingInfo(0,0)));
		RemoveFromFreeList(0);
		mAssignedPositions[0] = 0;
		mAssignedPositionsAvailable[0] = false;
	}

	UIntToGlyphEncodingInfoMap::iterator it = mANSIRepresentation->mGlyphIDToEncodedChar.find(inGlyph);

	if(it == mANSIRepresentation->mGlyphIDToEncodedChar.end())
	{
		// as a default position, i'm grabbing the ansi bits. this should display nice charachters, when possible
		unsigned char encoding;
		if(inCharacters.size() > 0)
			encoding = (unsigned char)(inCharacters.back() & 0xff);
		else
			encoding = (unsigned char)(inGlyph & 0xff);
		if(mAssignedPositionsAvailable[encoding])
			RemoveFromFreeList(encoding);
		else
			encoding = AllocateFromFreeList(inGlyph);
		mAssignedPositions[encoding] = inGlyph;
		mAssignedPositionsAvailable[encoding] = false;
		it = mANSIRepresentation->mGlyphIDToEncodedChar.insert(
				UIntToGlyphEncodingInfoMap::value_type(inGlyph,GlyphEncodingInfo(encoding,inCharacters))).first;			
		--mAvailablePositionsCount;
	}
	return it->second.mEncodedCharacter;
}